

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

void __thiscall Centaurus::CharClass<char>::CharClass(CharClass<char> *this,wchar_t ch)

{
  Range<char> local_20;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_0019d090;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20._vptr_Range = (_func_int **)&PTR__Range_0019d0c0;
  local_20.m_start = (char)ch;
  local_20.m_end = local_20.m_start + '\x01';
  std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
  emplace_back<Centaurus::Range<char>>
            ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
             &this->m_ranges,&local_20);
  return;
}

Assistant:

CharClass(wchar_t ch)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(ch, ch + 1));
    }